

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

void __thiscall
bloaty::anon_unknown_0::ElfFile::ReadSegment(ElfFile *this,Elf64_Word index,Segment *segment)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bloaty *this_00;
  char *pcVar10;
  uint64_t a;
  undefined8 uVar11;
  Elf64_Off EVar12;
  Elf64_Addr EVar13;
  Elf64_Addr EVar14;
  Elf64_Xword EVar15;
  uint64_t b;
  char *pcVar16;
  ulong uVar17;
  Elf64_Xword EVar18;
  size_t in_R8;
  Arg *in_R9;
  string_view format;
  string_view data;
  string_view sVar19;
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  if ((this->header_).e_phnum <= index) {
    absl::substitute_internal::Arg::Arg(&local_60,index);
    absl::substitute_internal::Arg::Arg(&local_90,(this->header_).e_phnum);
    format._M_str = (char *)&local_60;
    format._M_len = (size_t)"segment $0 doesn\'t exist, only $1 segments";
    absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x2a,format,&local_90,in_R9);
    Throw(local_b0._M_dataplus._M_p,0x20e);
  }
  this_00 = (bloaty *)(this->data_)._M_len;
  pcVar10 = (this->data_)._M_str;
  a = (this->header_).e_phoff;
  b = CheckedMul((ulong)(this->header_).e_phentsize,(ulong)index);
  pcVar16 = (char *)CheckedAdd(a,b);
  if (this->is_64bit_ == true) {
    bVar1 = this->is_native_endian_;
    data._M_str = pcVar16;
    data._M_len = (size_t)pcVar10;
    sVar19 = StrictSubstr(this_00,data,0x38,in_R8);
    segment->range_ = sVar19;
    uVar11 = *(undefined8 *)(pcVar10 + (long)pcVar16);
    EVar12 = *(Elf64_Off *)(pcVar10 + (long)pcVar16 + 8);
    EVar13 = *(Elf64_Addr *)(pcVar10 + 0x10 + (long)pcVar16);
    EVar14 = *(Elf64_Addr *)((long)(pcVar10 + 0x10 + (long)pcVar16) + 8);
    EVar18 = *(Elf64_Xword *)(pcVar10 + 0x20 + (long)pcVar16);
    EVar15 = *(Elf64_Xword *)((long)(pcVar10 + 0x20 + (long)pcVar16) + 8);
    (segment->header_).p_type = (int)uVar11;
    (segment->header_).p_flags = (int)((ulong)uVar11 >> 0x20);
    (segment->header_).p_offset = EVar12;
    (segment->header_).p_vaddr = EVar13;
    (segment->header_).p_paddr = EVar14;
    (segment->header_).p_filesz = EVar18;
    (segment->header_).p_memsz = EVar15;
    (segment->header_).p_align = *(Elf64_Xword *)(pcVar10 + 0x30 + (long)pcVar16);
    if (bVar1 == true) {
      EVar18 = (segment->header_).p_filesz;
      goto LAB_0017ef93;
    }
    uVar8 = (segment->header_).p_type;
    uVar9 = (segment->header_).p_flags;
    (segment->header_).p_type =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    (segment->header_).p_flags =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar17 = (segment->header_).p_offset;
    (segment->header_).p_offset =
         uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
         (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
         (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
    uVar17 = (segment->header_).p_vaddr;
    (segment->header_).p_vaddr =
         uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
         (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
         (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
    uVar17 = (segment->header_).p_paddr;
    (segment->header_).p_paddr =
         uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
         (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
         (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
    uVar17 = (segment->header_).p_filesz;
    EVar18 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
             (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
             (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 |
             uVar17 << 0x38;
    (segment->header_).p_filesz = EVar18;
    uVar17 = (segment->header_).p_memsz;
    (segment->header_).p_memsz =
         uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
         (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
         (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
    uVar17 = (segment->header_).p_align;
    uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
             (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
             (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 |
             uVar17 << 0x38;
  }
  else {
    sVar19._M_str = pcVar16;
    sVar19._M_len = (size_t)pcVar10;
    sVar19 = StrictSubstr(this_00,sVar19,0x20,in_R8);
    segment->range_ = sVar19;
    uVar8 = *(uint *)(pcVar10 + (long)pcVar16);
    uVar9 = *(uint *)(pcVar10 + 4 + (long)pcVar16);
    uVar2 = *(uint *)(pcVar10 + 8 + (long)pcVar16);
    uVar3 = *(uint *)(pcVar10 + 0xc + (long)pcVar16);
    uVar4 = *(uint *)(pcVar10 + 0x10 + (long)pcVar16);
    EVar18 = (Elf64_Xword)uVar4;
    uVar5 = *(uint *)(pcVar10 + 0x14 + (long)pcVar16);
    uVar6 = *(uint *)(pcVar10 + 0x18 + (long)pcVar16);
    uVar7 = *(uint *)(pcVar10 + 0x1c + (long)pcVar16);
    uVar17 = (ulong)uVar7;
    if (this->is_native_endian_ == true) {
      (segment->header_).p_type = uVar8;
      (segment->header_).p_flags = uVar6;
      (segment->header_).p_offset = (ulong)uVar9;
      (segment->header_).p_vaddr = (ulong)uVar2;
      (segment->header_).p_paddr = (ulong)uVar3;
      (segment->header_).p_filesz = EVar18;
      (segment->header_).p_memsz = (ulong)uVar5;
    }
    else {
      (segment->header_).p_type =
           uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      (segment->header_).p_flags =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      (segment->header_).p_offset =
           (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18);
      (segment->header_).p_vaddr =
           (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
      (segment->header_).p_paddr =
           (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
      EVar18 = (Elf64_Xword)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      (segment->header_).p_filesz = EVar18;
      (segment->header_).p_memsz =
           (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
      uVar17 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18);
    }
  }
  (segment->header_).p_align = uVar17;
LAB_0017ef93:
  if (EVar18 != 0) {
    sVar19 = GetRegion(this,(segment->header_).p_offset,EVar18);
    segment->contents_ = sVar19;
  }
  return;
}

Assistant:

void ElfFile::ReadSegment(Elf64_Word index, Segment* segment) const {
  if (index >= header_.e_phnum) {
    THROWF("segment $0 doesn't exist, only $1 segments", index,
           header_.e_phnum);
  }

  Elf64_Phdr* header = &segment->header_;
  ReadStruct<Elf32_Phdr>(
      entire_file(),
      CheckedAdd(header_.e_phoff, CheckedMul(header_.e_phentsize, index)),
      PhdrMunger(), &segment->range_, header);
  if (header->p_filesz > 0) {
    segment->contents_ = GetRegion(header->p_offset, header->p_filesz);
  }
}